

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::weibull_dist<double>::icdf(weibull_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  int *piVar2;
  double dVar3;
  result_type_conflict2 rVar4;
  
  if ((x < 0.0) || (1.0 <= x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar4 = NAN;
  }
  else {
    dVar1 = (this->P).theta_;
    dVar3 = log1p(-x);
    dVar3 = pow(-dVar3,1.0 / (this->P).beta_);
    rVar4 = dVar3 * dVar1;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x >= 1) {
#if !(defined __CUDA_ARCH__)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.theta() * math::pow(-math::ln1p(-x), 1 / P.beta());
    }